

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_uint64 ma_dr_mp3_read_pcm_frames_f32(ma_dr_mp3 *pMP3,ma_uint64 framesToRead,float *pBufferOut)

{
  ma_uint64 mVar1;
  long in_RDX;
  ulong in_RSI;
  long in_RDI;
  ma_uint64 framesToReadNow;
  ma_uint64 framesRemaining;
  ma_uint64 framesJustRead;
  ma_uint64 totalPCMFramesRead;
  ma_int16 pTempS16 [8192];
  ulong local_4030;
  ma_int16 local_4028 [4];
  void *in_stack_ffffffffffffbfe0;
  ma_uint64 in_stack_ffffffffffffbfe8;
  ma_dr_mp3 *in_stack_ffffffffffffbff0;
  ma_uint64 local_8;
  
  if ((in_RDI == 0) || (*(long *)(in_RDI + 0x1a18) == 0)) {
    local_8 = 0;
  }
  else {
    local_4030 = 0;
    while ((local_4030 < in_RSI &&
           (mVar1 = ma_dr_mp3_read_pcm_frames_raw
                              (in_stack_ffffffffffffbff0,in_stack_ffffffffffffbfe8,
                               in_stack_ffffffffffffbfe0), mVar1 != 0))) {
      ma_dr_mp3_s16_to_f32
                ((float *)(in_RDX + local_4030 * 4 * (ulong)*(uint *)(in_RDI + 0x1a0c)),local_4028,
                 mVar1 * *(uint *)(in_RDI + 0x1a0c));
      local_4030 = mVar1 + local_4030;
    }
    local_8 = local_4030;
  }
  return local_8;
}

Assistant:

MA_API ma_uint64 ma_dr_mp3_read_pcm_frames_f32(ma_dr_mp3* pMP3, ma_uint64 framesToRead, float* pBufferOut)
{
    if (pMP3 == NULL || pMP3->onRead == NULL) {
        return 0;
    }
#if defined(MA_DR_MP3_FLOAT_OUTPUT)
    return ma_dr_mp3_read_pcm_frames_raw(pMP3, framesToRead, pBufferOut);
#else
    {
        ma_int16 pTempS16[8192];
        ma_uint64 totalPCMFramesRead = 0;
        while (totalPCMFramesRead < framesToRead) {
            ma_uint64 framesJustRead;
            ma_uint64 framesRemaining = framesToRead - totalPCMFramesRead;
            ma_uint64 framesToReadNow = MA_DR_MP3_COUNTOF(pTempS16) / pMP3->channels;
            if (framesToReadNow > framesRemaining) {
                framesToReadNow = framesRemaining;
            }
            framesJustRead = ma_dr_mp3_read_pcm_frames_raw(pMP3, framesToReadNow, pTempS16);
            if (framesJustRead == 0) {
                break;
            }
            ma_dr_mp3_s16_to_f32((float*)MA_DR_MP3_OFFSET_PTR(pBufferOut, sizeof(float) * totalPCMFramesRead * pMP3->channels), pTempS16, framesJustRead * pMP3->channels);
            totalPCMFramesRead += framesJustRead;
        }
        return totalPCMFramesRead;
    }
#endif
}